

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_drop(MDB_txn *txn,MDB_dbi dbi,int del)

{
  int local_34;
  MDB_cursor *pMStack_30;
  int rc;
  MDB_cursor *m2;
  MDB_cursor *mc;
  int del_local;
  MDB_dbi dbi_local;
  MDB_txn *txn_local;
  
  if (((((uint)del < 2) && (txn != (MDB_txn *)0x0)) && (dbi < txn->mt_numdbs)) &&
     ((txn->mt_dbflags[dbi] & 0x10) != 0)) {
    if ((txn->mt_flags & 0x20000) == 0x20000) {
      txn_local._4_4_ = 0xd;
    }
    else if (txn->mt_dbiseqs[dbi] == txn->mt_env->me_dbiseqs[dbi]) {
      mc._0_4_ = del;
      mc._4_4_ = dbi;
      _del_local = txn;
      txn_local._4_4_ = mdb_cursor_open(txn,dbi,&m2);
      if (txn_local._4_4_ == 0) {
        local_34 = mdb_drop0(m2,m2->mc_db->md_flags & 4);
        for (pMStack_30 = _del_local->mt_cursors[mc._4_4_]; pMStack_30 != (MDB_cursor *)0x0;
            pMStack_30 = pMStack_30->mc_next) {
          pMStack_30->mc_flags = pMStack_30->mc_flags & 0xfffffffc;
        }
        if (local_34 == 0) {
          if (((int)mc == 0) || (mc._4_4_ < 2)) {
            _del_local->mt_dbflags[mc._4_4_] = _del_local->mt_dbflags[mc._4_4_] | 1;
            _del_local->mt_dbs[mc._4_4_].md_depth = 0;
            _del_local->mt_dbs[mc._4_4_].md_branch_pages = 0;
            _del_local->mt_dbs[mc._4_4_].md_leaf_pages = 0;
            _del_local->mt_dbs[mc._4_4_].md_overflow_pages = 0;
            _del_local->mt_dbs[mc._4_4_].md_entries = 0;
            _del_local->mt_dbs[mc._4_4_].md_root = 0xffffffffffffffff;
            _del_local->mt_flags = _del_local->mt_flags | 4;
          }
          else {
            local_34 = mdb_del0(_del_local,1,&m2->mc_dbx->md_name,(MDB_val *)0x0,2);
            if (local_34 == 0) {
              _del_local->mt_dbflags[mc._4_4_] = '\x02';
              mdb_dbi_close(_del_local->mt_env,mc._4_4_);
            }
            else {
              _del_local->mt_flags = _del_local->mt_flags | 2;
            }
          }
        }
        mdb_cursor_close(m2);
        txn_local._4_4_ = local_34;
      }
    }
    else {
      txn_local._4_4_ = -0x783c;
    }
  }
  else {
    txn_local._4_4_ = 0x16;
  }
  return txn_local._4_4_;
}

Assistant:

int mdb_drop(MDB_txn *txn, MDB_dbi dbi, int del)
{
	MDB_cursor *mc, *m2;
	int rc;

	if ((unsigned)del > 1 || !TXN_DBI_EXIST(txn, dbi, DB_USRVALID))
		return EINVAL;

	if (F_ISSET(txn->mt_flags, MDB_TXN_RDONLY))
		return EACCES;

	if (TXN_DBI_CHANGED(txn, dbi))
		return MDB_BAD_DBI;

	rc = mdb_cursor_open(txn, dbi, &mc);
	if (rc)
		return rc;

	rc = mdb_drop0(mc, mc->mc_db->md_flags & MDB_DUPSORT);
	/* Invalidate the dropped DB's cursors */
	for (m2 = txn->mt_cursors[dbi]; m2; m2 = m2->mc_next)
		m2->mc_flags &= ~(C_INITIALIZED|C_EOF);
	if (rc)
		goto leave;

	/* Can't delete the main DB */
	if (del && dbi >= CORE_DBS) {
		rc = mdb_del0(txn, MAIN_DBI, &mc->mc_dbx->md_name, NULL, F_SUBDATA);
		if (!rc) {
			txn->mt_dbflags[dbi] = DB_STALE;
			mdb_dbi_close(txn->mt_env, dbi);
		} else {
			txn->mt_flags |= MDB_TXN_ERROR;
		}
	} else {
		/* reset the DB record, mark it dirty */
		txn->mt_dbflags[dbi] |= DB_DIRTY;
		txn->mt_dbs[dbi].md_depth = 0;
		txn->mt_dbs[dbi].md_branch_pages = 0;
		txn->mt_dbs[dbi].md_leaf_pages = 0;
		txn->mt_dbs[dbi].md_overflow_pages = 0;
		txn->mt_dbs[dbi].md_entries = 0;
		txn->mt_dbs[dbi].md_root = P_INVALID;

		txn->mt_flags |= MDB_TXN_DIRTY;
	}
leave:
	mdb_cursor_close(mc);
	return rc;
}